

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_utils.cpp
# Opt level: O0

size_t cubeb_sample_size(cubeb_sample_format format)

{
  cubeb_sample_format format_local;
  undefined8 local_8;
  
  if (format < CUBEB_SAMPLE_FLOAT32LE) {
    local_8 = 2;
  }
  else if (format - CUBEB_SAMPLE_FLOAT32LE < 2) {
    local_8 = 4;
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

size_t cubeb_sample_size(cubeb_sample_format format)
{
  switch (format) {
    case CUBEB_SAMPLE_S16LE:
    case CUBEB_SAMPLE_S16BE:
      return sizeof(int16_t);
    case CUBEB_SAMPLE_FLOAT32LE:
    case CUBEB_SAMPLE_FLOAT32BE:
      return sizeof(float);
    default:
      // should never happen as all cases are handled above.
      assert(false);
      return 0;
  }
}